

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O3

RBBINode * __thiscall icu_63::RBBIRuleScanner::pushNewNode(RBBIRuleScanner *this,NodeType t)

{
  RBBIRuleBuilder *pRVar1;
  UErrorCode *pUVar2;
  UParseError *pUVar3;
  int32_t iVar4;
  RBBINode *this_00;
  undefined4 in_register_00000034;
  
  pRVar1 = this->fRB;
  pUVar2 = pRVar1->fStatus;
  if (*pUVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fNodeStackPtr < 99) {
      this->fNodeStackPtr = this->fNodeStackPtr + 1;
      this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,CONCAT44(in_register_00000034,t));
      if (this_00 != (RBBINode *)0x0) {
        RBBINode::RBBINode(this_00,t);
        this->fNodeStack[this->fNodeStackPtr] = this_00;
        return this_00;
      }
      this->fNodeStack[this->fNodeStackPtr] = (RBBINode *)0x0;
      *this->fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      *pUVar2 = U_BRK_RULE_SYNTAX;
      pUVar3 = pRVar1->fParseError;
      if (pUVar3 != (UParseError *)0x0) {
        iVar4 = this->fCharNum;
        pUVar3->line = this->fLineNum;
        pUVar3->offset = iVar4;
        pUVar3->preContext[0] = L'\0';
        pUVar3->postContext[0] = L'\0';
        return (RBBINode *)0x0;
      }
    }
  }
  return (RBBINode *)0x0;
}

Assistant:

RBBINode  *RBBIRuleScanner::pushNewNode(RBBINode::NodeType  t) {
    if (U_FAILURE(*fRB->fStatus)) {
        return NULL;
    }
    if (fNodeStackPtr >= kStackSize - 1) {
        error(U_BRK_RULE_SYNTAX);
        RBBIDebugPuts("RBBIRuleScanner::pushNewNode - stack overflow.");
        return NULL;
    }
    fNodeStackPtr++;
    fNodeStack[fNodeStackPtr] = new RBBINode(t);
    if (fNodeStack[fNodeStackPtr] == NULL) {
        *fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    return fNodeStack[fNodeStackPtr];
}